

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibBase.cpp
# Opt level: O3

int lib::base::Print(State *state)

{
  bool bVar1;
  int iVar2;
  ValueT VVar3;
  char *pcVar4;
  char *__format;
  int index;
  StackAPI api;
  StackAPI local_40;
  
  luna::StackAPI::StackAPI(&local_40,state);
  iVar2 = luna::StackAPI::GetStackSize(&local_40);
  if (0 < iVar2) {
    index = 0;
    do {
      VVar3 = luna::StackAPI::GetValueType(&local_40,index);
      switch(VVar3) {
      case ValueT_Nil:
        printf("nil");
        goto switchD_0011fd09_caseD_3;
      case ValueT_Bool:
        bVar1 = luna::StackAPI::GetBool(&local_40,index);
        pcVar4 = "false";
        if (bVar1) {
          pcVar4 = "true";
        }
        __format = "%s";
        break;
      case ValueT_Number:
        luna::StackAPI::GetNumber(&local_40,index);
        printf("%.14g");
      default:
        goto switchD_0011fd09_caseD_3;
      case ValueT_String:
        pcVar4 = luna::StackAPI::GetCString(&local_40,index);
        __format = "%s";
        break;
      case ValueT_Closure:
        pcVar4 = (char *)luna::StackAPI::GetClosure(&local_40,index);
        goto LAB_0011fdad;
      case ValueT_Table:
        pcVar4 = (char *)luna::StackAPI::GetTable(&local_40,index);
        __format = "table:\t%p";
        break;
      case ValueT_UserData:
        pcVar4 = (char *)luna::StackAPI::GetUserData(&local_40,index);
        __format = "userdata:\t%p";
        break;
      case ValueT_CFunction:
        pcVar4 = (char *)luna::StackAPI::GetCFunction(&local_40,index);
LAB_0011fdad:
        __format = "function:\t%p";
      }
      printf(__format,pcVar4);
switchD_0011fd09_caseD_3:
      if (index - iVar2 != -1) {
        putchar(9);
      }
      index = index + 1;
    } while (index != iVar2);
  }
  putchar(10);
  return 0;
}

Assistant:

int Print(luna::State *state)
    {
        luna::StackAPI api(state);
        int params = api.GetStackSize();

        for (int i = 0; i < params; ++i)
        {
            luna::ValueT type = api.GetValueType(i);

            switch (type) {
                case luna::ValueT_Nil:
                    printf("nil");
                    break;
                case luna::ValueT_Bool:
                    printf("%s", api.GetBool(i) ? "true" : "false");
                    break;
                case luna::ValueT_Number:
                    printf("%.14g", api.GetNumber(i));
                    break;
                case luna::ValueT_String:
                    printf("%s", api.GetCString(i));
                    break;
                case luna::ValueT_Closure:
                    printf("function:\t%p", api.GetClosure(i));
                    break;
                case luna::ValueT_Table:
                    printf("table:\t%p", api.GetTable(i));
                    break;
                case luna::ValueT_UserData:
                    printf("userdata:\t%p", api.GetUserData(i));
                    break;
                case luna::ValueT_CFunction:
                    printf("function:\t%p", api.GetCFunction(i));
                    break;
                default:
                    break;
            }

            if (i != params - 1)
                printf("\t");
        }

        printf("\n");
        return 0;
    }